

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ans.h
# Opt level: O2

int __thiscall draco::RAnsDecoder<19>::read_init(RAnsDecoder<19> *this,uint8_t *buf,int offset)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 1;
  if (0 < offset) {
    (this->ans_).buf = buf;
    uVar2 = offset - 1;
    if (buf[uVar2] < 0x40) {
      (this->ans_).buf_offset = uVar2;
      uVar2 = buf[uVar2] & 0x3f;
    }
    else {
      bVar1 = buf[uVar2] >> 6;
      if (bVar1 == 2) {
        if ((uint)offset < 3) {
          return 1;
        }
        (this->ans_).buf_offset = offset + -3;
        uVar2 = (*(ushort *)(buf + ((ulong)(uint)offset - 2)) & 0x3fff) << 8 |
                (uint)buf[(ulong)(uint)offset - 3];
      }
      else if (bVar1 == 1) {
        if (offset == 1) {
          return 1;
        }
        (this->ans_).buf_offset = offset + -2;
        uVar2 = *(ushort *)(buf + ((ulong)(uint)offset - 2)) & 0x3fff;
      }
      else {
        (this->ans_).buf_offset = offset + -4;
        uVar2 = *(uint *)(buf + ((ulong)(uint)offset - 4)) & 0x3fffffff;
      }
    }
    (this->ans_).state = uVar2 + 0x200000;
    uVar2 = (uint)(0x1fdfffff < uVar2);
  }
  return uVar2;
}

Assistant:

inline int read_init(const uint8_t *const buf, int offset) {
    unsigned x;
    if (offset < 1) {
      return 1;
    }
    ans_.buf = buf;
    x = buf[offset - 1] >> 6;
    if (x == 0) {
      ans_.buf_offset = offset - 1;
      ans_.state = buf[offset - 1] & 0x3F;
    } else if (x == 1) {
      if (offset < 2) {
        return 1;
      }
      ans_.buf_offset = offset - 2;
      ans_.state = mem_get_le16(buf + offset - 2) & 0x3FFF;
    } else if (x == 2) {
      if (offset < 3) {
        return 1;
      }
      ans_.buf_offset = offset - 3;
      ans_.state = mem_get_le24(buf + offset - 3) & 0x3FFFFF;
    } else if (x == 3) {
      ans_.buf_offset = offset - 4;
      ans_.state = mem_get_le32(buf + offset - 4) & 0x3FFFFFFF;
    } else {
      return 1;
    }
    ans_.state += l_rans_base;
    if (ans_.state >= l_rans_base * DRACO_ANS_IO_BASE) {
      return 1;
    }
    return 0;
  }